

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::Base64EncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  unsigned_long length;
  size_t sVar1;
  allocator_type local_251;
  vector<char,_std::allocator<char>_> encoded_buffer;
  vector<char,_std::allocator<char>_> file_buffer;
  ifstream ifs;
  
  length = cmsys::SystemTools::FileLength(file);
  std::ifstream::ifstream(&ifs,(file->_M_dataplus)._M_p,_S_in);
  std::vector<char,_std::allocator<char>_>::vector
            (&file_buffer,length + 1,(allocator_type *)&encoded_buffer);
  std::istream::read((char *)&ifs,
                     (long)file_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::ifstream::close();
  std::vector<char,_std::allocator<char>_>::vector(&encoded_buffer,(length * 3 >> 1) + 5,&local_251)
  ;
  sVar1 = cmsysBase64_Encode((uchar *)file_buffer.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,length,
                             (uchar *)encoded_buffer.super__Vector_base<char,_std::allocator<char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             encoded_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             encoded_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + sVar1);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&encoded_buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&file_buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64EncodeFile(std::string const& file)
{
  size_t const len = cmSystemTools::FileLength(file);
  cmsys::ifstream ifs(file.c_str(),
                      std::ios::in
#ifdef _WIN32
                        | std::ios::binary
#endif
  );
  std::vector<char> file_buffer(len + 1);
  ifs.read(file_buffer.data(), len);
  ifs.close();

  std::vector<char> encoded_buffer((len * 3) / 2 + 5);

  size_t const rlen = cmsysBase64_Encode(
    reinterpret_cast<unsigned char*>(file_buffer.data()), len,
    reinterpret_cast<unsigned char*>(encoded_buffer.data()), 1);

  return std::string(encoded_buffer.data(), rlen);
}